

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

int one_hit_new(CHAR_DATA *ch,CHAR_DATA *victim,int dt,bool specials,bool blockable,int addition,
               int multiplier,char *dnoun)

{
  ulong uVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  const_reference pvVar7;
  int *piVar8;
  CClass *this;
  OBJ_AFFECT_DATA *pOVar9;
  int in_EDX;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  byte in_R8B;
  undefined4 in_R9D;
  __type_conflict2 _Var10;
  undefined4 in_stack_00000008;
  char *in_stack_00000010;
  AFFECT_DATA af_1;
  OBJ_AFFECT_DATA *poison;
  int level;
  bool truestrike;
  float dam;
  int rdt;
  int result;
  int tmp_dt;
  int dam_type;
  int skill;
  int sn;
  int diceroll2;
  int diceroll;
  int mdam;
  AFFECT_DATA *af;
  OBJ_DATA *dualw;
  OBJ_DATA *wield;
  undefined1 in_stack_00001232;
  undefined1 in_stack_00001233;
  int in_stack_00001234;
  int in_stack_00001238;
  int in_stack_0000123c;
  CHAR_DATA *in_stack_00001240;
  CHAR_DATA *in_stack_00001248;
  int in_stack_00001268;
  int in_stack_00001270;
  char *in_stack_00001278;
  CHAR_DATA *in_stack_fffffffffffffeb8;
  undefined1 *puVar11;
  AFFECT_DATA *paf;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  char_data *in_stack_fffffffffffffed0;
  char *txt;
  ulong local_120;
  int in_stack_fffffffffffffef4;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int local_fc;
  int local_f8 [8];
  undefined2 local_d6;
  short local_d4;
  undefined2 local_d2;
  short local_d0;
  undefined2 local_ce;
  undefined2 local_cc;
  ulong local_c8;
  undefined4 local_b8;
  undefined1 in_stack_ffffffffffffff6f;
  OBJ_DATA *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  int local_7c;
  int local_78;
  byte local_71;
  float local_70;
  int in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 success;
  int in_stack_ffffffffffffff9c;
  int iVar13;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  CHAR_DATA *pCVar14;
  CHAR_DATA *local_38;
  int local_24;
  CHAR_DATA *local_20;
  CHAR_DATA *local_18;
  int local_c;
  undefined4 uVar12;
  
  success = (undefined1)((uint)in_stack_ffffffffffffff98 >> 0x18);
  iVar6 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  pCVar14 = (CHAR_DATA *)0x0;
  local_71 = 0;
  if (((((in_RSI == in_RDI) || (in_RDI == (CHAR_DATA *)0x0)) || (in_RSI == (CHAR_DATA *)0x0)) ||
      (in_RSI->position == 0)) ||
     (((in_RDI->in_room != in_RSI->in_room && (in_EDX != gsn_hurl)) ||
      (local_24 = in_EDX, local_20 = in_RSI, local_18 = in_RDI,
      bVar2 = is_safe((CHAR_DATA *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffeb8), bVar2)))) {
    local_c = 0;
  }
  else {
    if (local_24 == -3) {
      local_71 = 1;
      local_24 = -1;
    }
    local_38 = (CHAR_DATA *)get_eq_char(local_18,0x10);
    if (local_24 == gsn_dual_wield) {
      local_38 = (CHAR_DATA *)get_eq_char(local_18,0x12);
    }
    if ((local_24 == -1) || (local_24 == gsn_dual_wield)) {
      if ((local_38 == (CHAR_DATA *)0x0) || (*(short *)&local_38->carrying != 5)) {
        local_24 = (int)local_18->dam_type;
      }
      else {
        local_24 = *(int *)&local_38->prefix;
      }
      local_24 = local_24 + 1000;
    }
    if (local_38 == (CHAR_DATA *)0x0) {
      pvVar7 = std::vector<attack_type,_std::allocator<attack_type>_>::operator[]
                         (&attack_table,(long)local_18->dam_type);
      iVar13 = pvVar7->damage;
    }
    else {
      pvVar7 = std::vector<attack_type,_std::allocator<attack_type>_>::operator[]
                         (&attack_table,(long)*(int *)&local_38->prefix);
      iVar13 = pvVar7->damage;
    }
    if (iVar13 == -1) {
      iVar13 = 1;
    }
    iVar4 = get_weapon_sn_new(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    iVar5 = get_weapon_skill((CHAR_DATA *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                             (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
    iVar5 = iVar5 + 0x14;
    if ((local_71 & 1) != 0) {
      iVar13 = 0x13;
    }
    bVar2 = is_npc(in_stack_fffffffffffffeb8);
    if ((bVar2) && (local_38 == (CHAR_DATA *)0x0)) {
      iVar4 = dice(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      local_70 = (float)iVar4;
    }
    else {
      if (iVar4 != -1) {
        check_improve((CHAR_DATA *)CONCAT44(iVar5,iVar13),in_stack_ffffffffffffff9c,(bool)success,
                      in_stack_ffffffffffffff94);
      }
      iVar4 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
      if (local_38 == (CHAR_DATA *)0x0) {
        iVar4 = number_range(in_stack_fffffffffffffec0,iVar4);
        local_70 = (float)iVar4;
      }
      else {
        iVar4 = dice(in_stack_fffffffffffffec0,iVar4);
        local_70 = (float)((iVar4 * iVar5) / 100);
        if ((int)*(short *)&local_38->short_descr - (int)local_18->level < 0x23) {
          if ((int)*(short *)&local_38->short_descr - (int)local_18->level < 0x19) {
            if ((int)*(short *)&local_38->short_descr - (int)local_18->level < 0xf) {
              if (4 < (int)*(short *)&local_38->short_descr - (int)local_18->level) {
                local_70 = (local_70 * 9.0) / 10.0;
              }
            }
            else {
              local_70 = (local_70 * 8.0) / 10.0;
            }
          }
          else {
            local_70 = (local_70 * 7.0) / 10.0;
          }
        }
        else {
          local_70 = (local_70 * 6.0) / 10.0;
        }
        bVar2 = is_weapon_stat((OBJ_DATA *)
                               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                               in_stack_fffffffffffffec4);
        if ((bVar2) &&
           (in_stack_fffffffffffffefc = number_percent(), in_stack_fffffffffffffefc <= iVar5 / 8)) {
          local_70 = local_70 * 1.2;
        }
      }
    }
    iVar4 = get_skill(pCVar14,iVar6);
    if (iVar4 < 1) {
      local_70 = local_70 * 0.7;
    }
    else {
      in_stack_fffffffffffffef8 = number_percent();
      iVar4 = get_skill(pCVar14,iVar6);
      if (in_stack_fffffffffffffef8 <= iVar4) {
        check_improve((CHAR_DATA *)CONCAT44(iVar5,iVar13),in_stack_ffffffffffffff9c,(bool)success,
                      in_stack_ffffffffffffff94);
        iVar4 = number_percent();
        local_70 = ((float)(iVar4 / 200 + 3) * local_70) / 2.0;
      }
      char_data::Class(in_stack_fffffffffffffed0);
      bVar2 = RString::operator==((RString *)
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                  (char *)in_stack_fffffffffffffeb8);
      if (bVar2) {
        local_70 = local_70 * 0.75;
      }
      iVar4 = get_skill(pCVar14,iVar6);
      if ((0 < iVar4) && (bVar2 = is_npc(in_stack_fffffffffffffeb8), !bVar2)) {
        in_stack_fffffffffffffef4 = number_percent();
        iVar6 = get_skill(pCVar14,iVar6);
        if ((in_stack_fffffffffffffef4 < iVar6) &&
           (((bVar2 = style_check(in_stack_fffffffffffffec0,
                                  (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)), bVar2 &&
             (local_38 != (CHAR_DATA *)0x0)) && (0xe < *(short *)&local_38->field_0x102)))) {
          check_improve((CHAR_DATA *)CONCAT44(iVar5,iVar13),in_stack_ffffffffffffff9c,(bool)success,
                        in_stack_ffffffffffffff94);
          local_70 = (local_70 * 5.0) / 4.0;
        }
      }
    }
    pCVar14 = (CHAR_DATA *)affect_find(local_18->affected,(int)gsn_hardenfist);
    if (((local_38 == (CHAR_DATA *)0x0) &&
        (bVar2 = is_affected(local_18,(int)gsn_hardenfist), bVar2)) && (pCVar14 != (CHAR_DATA *)0x0)
       ) {
      iVar6 = dice(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      local_70 = (float)(((iVar6 + 10) * iVar5) / 100);
    }
    sVar3 = get_damroll(in_stack_fffffffffffffeb8);
    local_78 = 100;
    piVar8 = std::min<int>(&local_78,(int *)&stack0xffffffffffffffa4);
    local_70 = (float)(((int)sVar3 * *piVar8) / 100) + local_70;
    bVar2 = is_npc(in_stack_fffffffffffffeb8);
    if (!bVar2) {
      local_70 = pc_race_table[local_18->race].racialDam * local_70;
    }
    bVar2 = is_npc(in_stack_fffffffffffffeb8);
    if (((!bVar2) && (bVar2 = is_affected(local_18,(int)gsn_rage), bVar2)) &&
       ((local_18->pcdata->tribe == 1 && (iVar6 = number_percent(), iVar6 < 10)))) {
      send_to_char((char *)in_stack_fffffffffffffed0,
                   (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      act((char *)in_stack_fffffffffffffed0,
          (CHAR_DATA *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
          (void *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
          in_stack_fffffffffffffeb8,0);
      local_70 = (float)((int)local_18->level / 0x14) * local_70;
    }
    if (local_70 <= 0.0) {
      local_70 = 1.0;
    }
    bVar2 = is_npc(in_stack_fffffffffffffeb8);
    if (((!bVar2) && (local_38 == (CHAR_DATA *)0x0)) &&
       ((999 < local_24 || (local_24 == gsn_dual_wield)))) {
      local_24 = 0x3f9;
    }
    if (local_38 != (CHAR_DATA *)0x0) {
      this = char_data::Class(in_stack_fffffffffffffed0);
      iVar6 = CClass::GetIndex(this);
      if ((((iVar6 == 4) && (local_18->fighting != (CHAR_DATA *)0x0)) && (999 < local_24)) &&
         (iVar6 = check_arms(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                             (bool)in_stack_ffffffffffffff6f), 0 < iVar6)) {
        local_24 = iVar6 + 1000;
      }
    }
    if ((local_38 != (CHAR_DATA *)0x0) &&
       (((((OBJ_INDEX_DATA *)local_38->last_fight_name)->spec_prog).trapvector & 0x2000U) != 0)) {
      in_stack_fffffffffffffeb8 = (CHAR_DATA *)&stack0xffffffffffffffa0;
      iVar6 = (*(((OBJ_INDEX_DATA *)local_38->last_fight_name)->spec_prog).func)
                        (0x2000,local_18,local_20,local_38,&local_70,&stack0xffffffffffffffdc);
      if (0 < iVar6) {
        return 0;
      }
    }
    bVar2 = is_npc(in_stack_fffffffffffffeb8);
    uVar12 = (undefined4)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
    if ((bVar2) &&
       (uVar1 = local_20->act[0], _Var10 = std::pow<int,int>(0,0x5d9435),
       (uVar1 & (long)_Var10) != 0)) {
      local_120 = (local_20->pIndexData->spec_prog).trapvector & 0x2000;
    }
    else {
      local_120 = 0;
    }
    if (local_120 != 0) {
      puVar11 = &stack0xffffffffffffffa0;
      iVar6 = (*(local_20->pIndexData->spec_prog).func)
                        (0x2000,local_18,local_20,local_38,&local_70,&stack0xffffffffffffffdc,
                         puVar11);
      uVar12 = (undefined4)((ulong)puVar11 >> 0x20);
      if (0 < iVar6) {
        return 0;
      }
    }
    paf = (AFFECT_DATA *)CONCAT44(uVar12,(uint)(in_R8B & 1));
    iVar6 = damage_new(in_stack_00001248,in_stack_00001240,in_stack_0000123c,in_stack_00001238,
                       in_stack_00001234,(bool)in_stack_00001233,(bool)in_stack_00001232,
                       in_stack_00001268,in_stack_00001270,in_stack_00001278);
    if (iVar6 == -1) {
      local_c = -1;
    }
    else {
      txt = in_stack_00000010;
      if ((local_38 != (CHAR_DATA *)0x0) &&
         (uVar1 = *(ulong *)&local_38->group, _Var10 = std::pow<int,int>(0,0x5d959d),
         txt = in_stack_00000010, (uVar1 & (long)_Var10) != 0)) {
        (*((OBJ_INDEX_DATA *)local_38->last_fight_name)->iprogs->hit_prog)
                  ((OBJ_DATA *)local_38,local_18,local_20,iVar6);
        txt = in_stack_00000010;
      }
      local_c = iVar6;
      if ((((iVar6 != 0) && (local_38 != (CHAR_DATA *)0x0)) && (local_18->fighting == local_20)) &&
         (bVar2 = is_weapon_stat((OBJ_DATA *)CONCAT44(in_stack_fffffffffffffecc,in_stack_00000008),
                                 in_stack_fffffffffffffec4), local_c = iVar6, bVar2)) {
        pOVar9 = affect_find_obj(*(OBJ_AFFECT_DATA **)&local_38->tracktimer,(int)gsn_poison);
        if (pOVar9 == (OBJ_AFFECT_DATA *)0x0) {
          sVar3 = *(short *)&local_38->short_descr;
        }
        else {
          sVar3 = pOVar9->level;
        }
        local_7c = (int)sVar3;
        bVar2 = saves_spell(in_stack_ffffffffffffff00,
                            (CHAR_DATA *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                            in_stack_fffffffffffffef4);
        if ((!bVar2) &&
           (bVar2 = is_affected_by((CHAR_DATA *)
                                   CONCAT44(in_stack_fffffffffffffecc,in_stack_00000008),
                                   in_stack_fffffffffffffec4), !bVar2)) {
          send_to_char(txt,(CHAR_DATA *)CONCAT44(in_stack_fffffffffffffecc,in_stack_00000008));
          act(txt,(CHAR_DATA *)CONCAT44(in_stack_fffffffffffffecc,in_stack_00000008),
              (void *)CONCAT44(in_stack_fffffffffffffec4,in_R9D),paf,0);
          init_affect((AFFECT_DATA *)0x5d9727);
          local_d6 = 0;
          local_b8 = 0;
          local_d4 = gsn_poison;
          local_d2 = (undefined2)((local_7c * 3) / 4);
          local_d0 = sVar3 / 10;
          local_ce = 1;
          local_cc = 0xfffd;
          _Var10 = std::pow<int,int>(0,0x5d978e);
          local_c8 = (long)_Var10 | local_c8;
          affect_join((CHAR_DATA *)CONCAT44(in_stack_fffffffffffffec4,in_R9D),paf);
        }
        local_c = iVar6;
        if (pOVar9 != (OBJ_AFFECT_DATA *)0x0) {
          local_f8[1] = 0;
          local_f8[0] = pOVar9->level + -2;
          piVar8 = std::max<int>(local_f8 + 1,local_f8);
          pOVar9->level = (short)*piVar8;
          local_fc = 0;
          piVar8 = std::max<int>(&local_fc,(int *)&stack0xffffffffffffff00);
          pOVar9->duration = (short)*piVar8;
          if ((pOVar9->level == 0) || (local_c = iVar6, pOVar9->duration == 0)) {
            act(txt,(CHAR_DATA *)CONCAT44(in_stack_fffffffffffffecc,in_stack_00000008),
                (void *)CONCAT44(in_stack_fffffffffffffec4,in_R9D),paf,0);
            local_c = iVar6;
          }
        }
      }
    }
  }
  return local_c;
}

Assistant:

int one_hit_new(CHAR_DATA *ch, CHAR_DATA *victim, int dt, bool specials, bool blockable, int addition, int multiplier, char *dnoun)
{
	OBJ_DATA *wield = nullptr, *dualw = nullptr;
	AFFECT_DATA *af;
	int mdam, diceroll, diceroll2 = 0, sn, skill, dam_type, tmp_dt, result, rdt;
	float dam;
	bool truestrike = false;

	if (victim == ch
		|| ch == nullptr
		|| victim == nullptr
		|| victim->position == POS_DEAD
		|| (ch->in_room != victim->in_room && dt != gsn_hurl) || is_safe(ch, victim))
	{
		return 0;
	}

	if (dt == TYPE_TRUESTRIKE)
	{
		truestrike = true;
		dt = TYPE_UNDEFINED;
	}

	wield = get_eq_char(ch, WEAR_WIELD);

	if (dt == gsn_dual_wield)
		wield = get_eq_char(ch, WEAR_DUAL_WIELD);

	if (dt == TYPE_UNDEFINED || dt == gsn_dual_wield)
	{
		dt = TYPE_HIT;

		if (wield != nullptr && wield->item_type == ITEM_WEAPON)
			dt += wield->value[3];
		else
			dt += ch->dam_type;
	}

	if (wield != nullptr)
		dam_type = attack_table[wield->value[3]].damage;
	else
		dam_type = attack_table[ch->dam_type].damage;

	if (dam_type == -1)
		dam_type = DAM_BASH;

	sn = get_weapon_sn_new(ch, dt);
	skill = 20 + get_weapon_skill(ch, sn);

	if (truestrike)
		dam_type = DAM_TRUESTRIKE;

	if (is_npc(ch) && wield == nullptr)
	{
		dam = dice(ch->damage[DICE_NUMBER], ch->damage[DICE_TYPE]);
	}
	else
	{
		if (sn != -1)
			check_improve(ch, sn, true, 5);

		if (wield != nullptr)
		{
			dam = dice(wield->value[1], wield->value[2]) * skill / 100;

			if (wield->level - ch->level >= 35)
				dam = (dam * 6) / 10;
			else if (wield->level - ch->level >= 25)
				dam = (dam * 7) / 10;
			else if (wield->level - ch->level >= 15)
				dam = (dam * 8) / 10;
			else if (wield->level - ch->level >= 5)
				dam = (dam * 9) / 10;

			if (is_weapon_stat(wield, WEAPON_SHARP))
			{
				if (number_percent() <= (skill / 8))
					dam *= 1.2;
			}
		}
		else
		{
			dam = number_range(1 + 4 * skill / 100, 2 * ch->level / 3 * skill / 100);
		}
	}

	if (get_skill(ch, gsn_enhanced_damage) > 0)
	{
		if (number_percent() <= get_skill(ch, gsn_enhanced_damage))
		{
			check_improve(ch, gsn_enhanced_damage, true, 6);
			dam *= 3 + (number_percent() / 200);
			dam /= 2;
		}

		if (ch->Class()->name == "thief")
			dam *= 0.75;

		if (get_skill(ch, gsn_brutality) > 0
			&& !is_npc(ch)
			&& number_percent() < get_skill(ch, gsn_brutality)
			&& style_check(gsn_brutality, ch->pcdata->style)
			&& (wield != nullptr && wield->weight >= 15))
		{
			check_improve(ch, gsn_brutality, true, 5);
			dam *= 5;
			dam /= 4;
		}
	}
	else
	{
		dam *= (float).7;
	}

	af = affect_find(ch->affected, gsn_hardenfist);

	if (wield == nullptr && is_affected(ch, gsn_hardenfist) && af)
		dam = (dice((af->level / 4), 4) + 10) * skill / 100;

	mdam = get_damroll(ch);
	dam += mdam * std::min(100, skill) / 100;

	if (!is_npc(ch))
		dam *= pc_race_table[ch->race].racialDam;

	if (!is_npc(ch) && is_affected(ch, gsn_rage) && ch->pcdata->tribe == TRIBE_BOAR && number_percent() < 10)
	{
		send_to_char("The fury of the Boar enrages you as you deliver a mighty blow!\n\r", ch);
		act("$n gets an enraged look in $s eyes and delivers a mighty blow!", ch, 0, 0, TO_ROOM);
		dam *= ch->level / 20;
	}

	if (dam <= 0)
		dam = 1;

	if (!is_npc(ch) && wield == nullptr && (dt >= TYPE_HIT || dt == gsn_dual_wield))
		dt = TYPE_HIT + 17; // hth = #17

	if (wield
		&& ch->Class()->GetIndex() == CLASS_PALADIN
		&& ch->fighting
		&& dt >= TYPE_HIT
		&& (rdt = check_arms(ch, wield, false)) > 0) // check_arms returns 0 if normal
	{
		dt = rdt + TYPE_HIT;
	}

	if (wield && TRAPS_IEVENT(wield, TRAP_IONEHIT))
	{
		if (CALL_IEVENT(wield, TRAP_IONEHIT, ch, victim, wield, &dam, &dt, &dam_type) > 0)
			return 0;
	}

	// mob onehit [mhit] fires when mob is hit, but item onehit fires when item does the hitting

	if (is_npc(victim) && TRAPS_MEVENT(victim, TRAP_MONEHIT))
	{
		if (CALL_IEVENT(victim, TRAP_MONEHIT, ch, victim, wield, &dam, &dt, &dam_type) > 0)
			return 0;
	}

	result = damage_new(ch, victim, (int)dam, dt, dam_type, true, blockable, addition, multiplier, dnoun);

	if (result == -1) // death
		return -1;

	if (wield && IS_SET(wield->progtypes, IPROG_HIT))
		(wield->pIndexData->iprogs->hit_prog)(wield, ch, victim, result);

	if (result && wield != nullptr)
	{
		if (ch->fighting == victim && is_weapon_stat(wield, WEAPON_POISON))
		{
			int level = 10;
			OBJ_AFFECT_DATA *poison;
			AFFECT_DATA af;

			poison = affect_find_obj(wield->affected, gsn_poison);

			if (poison == nullptr)
				level = wield->level;
			else
				level = poison->level;

			if (!saves_spell(level / 2, victim, DAM_POISON) && !is_affected_by(victim, AFF_POISON))
			{
				send_to_char("You feel poison coursing through your veins.\n\r", victim);
				act("$n is poisoned by the venom on $p.", victim, wield, nullptr, TO_ROOM);
				init_affect(&af);
				af.where = TO_AFFECTS;
				af.aftype = AFT_SPELL;
				af.type = gsn_poison;
				af.level = level * 3 / 4;
				af.duration = level / 10;
				af.location = APPLY_STR;
				af.modifier = -3;
				SET_BIT(af.bitvector, AFF_POISON);
				affect_join(victim, &af);
			}

			if (poison != nullptr)
			{
				poison->level = std::max(0, poison->level - 2);
				poison->duration = std::max(0, poison->duration - 1);

				if (poison->level == 0 || poison->duration == 0)
					act("The poison on $p has worn off.", ch, wield, nullptr, TO_CHAR);
			}
		}
	}

	return result;
}